

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

vector<CAddress,_std::allocator<CAddress>_> *
ReadAnchors(vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,
           path *anchors_db_path)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar2;
  FILE *file;
  CChainParams *pCVar3;
  runtime_error *this;
  code *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  SerParams *pSVar6;
  vector<CAddress,_std::allocator<CAddress>_> *pvVar7;
  MessageStartChars pchMsgTmp;
  AutoFile filein;
  base_blob<256U> local_e8;
  uint256 hashTmp;
  HashVerifier<AutoFile> verifier;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar6 = &CAddress::V2_DISK;
  pvVar7 = __return_storage_ptr__;
  file = fsbridge::fopen((char *)anchors_db_path,"rb");
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)pvVar7;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)pSVar6;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  AutoFile::AutoFile(&filein,(FILE *)file,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffec8);
  if (filein.m_file == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_00a16950;
    pcVar4 = std::exception::~exception;
    ppuVar5 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = &filein;
    Unserialize<HashVerifier<AutoFile>,_unsigned_char,_4UL>(&verifier,&pchMsgTmp);
    pCVar3 = Params();
    bVar2 = std::operator==(&pchMsgTmp,&pCVar3->pchMessageStart);
    if (bVar2) {
      ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>::
      Unserialize<HashVerifier<AutoFile>>
                ((ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>
                  *)&stack0xfffffffffffffeb8,&verifier);
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      base_blob<256U>::Unserialize<AutoFile>(&hashTmp.super_base_blob<256U>,&filein);
      HashWriter::GetHash((uint256 *)&local_e8,&verifier.super_HashWriter);
      bVar2 = operator!=((base_blob<256U> *)&hashTmp,&local_e8);
      if (!bVar2) {
        AutoFile::~AutoFile(&filein);
        local_e8.m_data._M_elems._0_8_ =
             ((long)(__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38;
        fs::path::filename((path *)&verifier,anchors_db_path);
        std::filesystem::__cxx11::path::string((string *)&filein,(path *)&verifier);
        hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\"';
        hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '&';
        logging_function._M_str = "ReadAnchors";
        logging_function._M_len = 0xb;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
        ;
        source_file._M_len = 0x5a;
        hashTmp.super_base_blob<256U>.m_data._M_elems._0_8_ = &filein;
        LogPrintFormatInternal<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                  (logging_function,source_file,0xea,ALL,Info,(ConstevalFormatString<2U>)0x6ca7b7,
                   (unsigned_long *)&local_e8,
                   (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                    *)&hashTmp);
        std::__cxx11::string::~string((string *)&filein);
        std::filesystem::__cxx11::path::~path((path *)&verifier);
        std::filesystem::remove((path *)anchors_db_path);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return __return_storage_ptr__;
        }
        goto LAB_00396260;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Checksum mismatch, data corrupted");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid network magic number");
    }
    pcVar4 = std::runtime_error::~runtime_error;
    ppuVar5 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(this,ppuVar5,pcVar4);
  }
LAB_00396260:
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> ReadAnchors(const fs::path& anchors_db_path)
{
    std::vector<CAddress> anchors;
    try {
        DeserializeFileDB(anchors_db_path, CAddress::V2_DISK(anchors));
        LogPrintf("Loaded %i addresses from %s\n", anchors.size(), fs::quoted(fs::PathToString(anchors_db_path.filename())));
    } catch (const std::exception&) {
        anchors.clear();
    }

    fs::remove(anchors_db_path);
    return anchors;
}